

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O0

void __thiscall
HEkkPrimal::shiftBound
          (HEkkPrimal *this,bool lower,HighsInt iVar,double value,double random_value,double *bound,
          double *shift)

{
  long lVar1;
  HighsLogOptions *log_options_;
  undefined8 uVar2;
  double *in_RCX;
  uint in_EDX;
  byte in_SIL;
  long *in_RDI;
  double *in_R8;
  undefined8 in_R9;
  HighsLogOptions *in_XMM0_Qa;
  double dVar3;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  double error;
  double new_infeasibility;
  double infeasibility;
  string type;
  double old_bound;
  double feasibility;
  double local_70;
  double local_68;
  string local_60 [32];
  double local_40;
  double local_38;
  double *local_30;
  double *local_28;
  char *local_20;
  HighsLogOptions *local_18;
  uint local_10;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_20 = (char *)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  local_38 = ((double)local_20 + 1.0) * (double)in_RDI[5];
  local_40 = *in_RCX;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_XMM0_Qa;
  local_10 = in_EDX;
  std::__cxx11::string::string(local_60);
  if ((local_9 & 1) == 0) {
    std::__cxx11::string::operator=(local_60,"upper");
    local_68 = (double)local_18 - *local_28;
    *local_30 = local_68 + local_38;
    *local_28 = *local_30 + *local_28;
    local_70 = (double)local_18 - *local_28;
  }
  else {
    std::__cxx11::string::operator=(local_60,"lower");
    local_68 = *local_28 - (double)local_18;
    *local_30 = local_68 + local_38;
    *local_28 = *local_28 - *local_30;
    local_70 = *local_28 - (double)local_18;
  }
  log_options_ = local_18;
  if (0.0 < local_70) {
    dVar3 = local_70 + local_38;
    lVar1 = *(long *)(*in_RDI + 8);
    uVar2 = std::__cxx11::string::c_str();
    highsLogDev(log_options_,SUB84(local_40,0),local_20,local_18,local_38,local_68,*local_30,
                *local_28,lVar1 + 0x380,1,
                "HEkkPrimal::shiftBound Value(%4d) = %10.4g exceeds %s: random_value = %g; value = %g; feasibility = %g; infeasibility = %g; shift = %g; bound = %g; new_infeasibility = %g with error %g\n"
                ,(ulong)local_10,uVar2,in_R9,local_70,ABS(dVar3));
    fflush(_stdout);
  }
  std::__cxx11::string::~string(local_60);
  return;
}

Assistant:

void HEkkPrimal::shiftBound(const bool lower, const HighsInt iVar,
                            const double value, const double random_value,
                            double& bound, double& shift) {
  // If infeasibility is very large, then adding feasibility may not
  // yield a new value (see #1144) so new_infeasibility < 0 is false,
  // tripping the old assert
  //
  // Ambros proposed adding feasibility
  // *(infeasibility/scale_threshold) when
  // infeasibility/scale_threshold > 1, but this could lead to a large
  // value for new_infeasibility. Sounds better to accept degeneracy
  // in this edge case.
  double feasibility = (1 + random_value) * primal_feasibility_tolerance;
  double old_bound = bound;
  std::string type;
  double infeasibility;
  double new_infeasibility;
  if (lower) {
    // Bound to shift is lower
    type = "lower";
    assert(value < bound - primal_feasibility_tolerance);
    infeasibility = bound - value;
    assert(infeasibility > 0);
    // Determine the amount by which value will be feasible - so that
    // (ideally) it's not degenerate
    shift = infeasibility + feasibility;
    bound -= shift;
    new_infeasibility = bound - value;
  } else {
    // Bound to shift is upper
    type = "upper";
    assert(value > bound + primal_feasibility_tolerance);
    infeasibility = value - bound;
    assert(infeasibility > 0);
    // Determine the amount by which value will be feasible - so that
    // (ideally) it's not degenerate
    shift = infeasibility + feasibility;
    bound += shift;
    new_infeasibility = value - bound;
  }
  if (new_infeasibility > 0) {
    // new_infeasibility should be non-positive, and negative unless
    // bound is excessively large, whereas feasibility is positive
    double error = std::fabs(new_infeasibility + feasibility);
    highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kInfo,
                "HEkkPrimal::shiftBound Value(%4d) = %10.4g exceeds %s: "
                "random_value = %g; value = %g; "
                "feasibility = %g; infeasibility = %g; shift = %g; bound = %g; "
                "new_infeasibility = %g with error %g\n",
                int(iVar), value, type.c_str(), old_bound, random_value, value,
                feasibility, infeasibility, shift, bound, new_infeasibility,
                error);
    fflush(stdout);
  }
  assert(new_infeasibility <= 0);
}